

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_utils.c
# Opt level: O2

size_t ht_event_utils_serialize_event_to_buffer
                 (HT_Event *event,HT_Byte *buffer,HT_Boolean serialize)

{
  HT_EventKlass *pHVar1;
  size_t sVar2;
  
  pHVar1 = event->klass;
  if (serialize != 0) {
    sVar2 = (*pHVar1->serialize)(event,buffer);
    return sVar2;
  }
  memcpy(buffer,event,pHVar1->type_info->size);
  return pHVar1->type_info->size;
}

Assistant:

size_t
ht_event_utils_serialize_event_to_buffer(HT_Event* event, HT_Byte* buffer, HT_Boolean serialize)
{
    HT_EventKlass* klass = HT_EVENT_GET_KLASS(event);

    if (serialize)
    {
        return klass->serialize(event, buffer);
    }
    else
    {
        memcpy(buffer, event, klass->type_info->size);
        return klass->type_info->size;
    }
}